

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_22652::
ARTIteratorTest_singleLeafSeek_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTIteratorTest_singleLeafSeek_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  pointer *ppaVar1;
  undefined8 uVar2;
  iterator *piVar3;
  char *pcVar4;
  char *in_R9;
  internal iVar5;
  value_view v;
  key_view kVar6;
  undefined1 local_2b0 [8];
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  iterator e;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  AssertionResult gtest_ar_;
  bool local_29;
  int iStack_28;
  undefined4 uStack_24;
  bool match;
  
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  tree_verifier((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)local_2b0,false);
  v._M_extent._M_extent_value = 2;
  v._M_ptr = (pointer)&unodb::test::test_value_2;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  insert_internal((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   *)local_2b0,1,v,false);
  ppaVar1 = &verifier.key_views.
             super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::iterator
            ((iterator *)ppaVar1,
             (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)&verifier);
  local_29 = false;
  piVar3 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
           seek((iterator *)ppaVar1,(art_key_type)0x100000000000000,&local_29,true);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  iVar5 = (internal)
          ((piVar3->stack_).c.
           super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          (piVar3->stack_).c.
          super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur);
  local_48._M_head_impl._0_1_ = iVar5;
  if (!(bool)iVar5) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_48,(AssertionResult *)"it.valid()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x140,(char *)e.keybuf_.off);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string((string *)&e.keybuf_.off);
    if ((long *)CONCAT44(uStack_24,iStack_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,iStack_28) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  local_48._M_head_impl._0_1_ = (internal)0x1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&e.keybuf_.off,"(match)","(true)",&local_29,(bool *)&local_48);
  if ((char)e.keybuf_.off == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x141,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd8,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd8);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  kVar6 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
          get_key(piVar3);
  uVar2 = *(undefined8 *)kVar6._M_ptr;
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar2 >> 0x38 | (ulong)(uVar2 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar2 & 0xff0000000000) >> 0x18 | (ulong)(uVar2 & 0xff00000000) >> 8 |
        (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
       uVar2 << 0x38);
  iStack_28 = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&e.keybuf_.off,"(decode(it.get_key()))","(1)",(unsigned_long *)&local_48,
             &stack0xffffffffffffffd8);
  if ((char)e.keybuf_.off == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x142,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd8,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd8);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  join_0x00000010_0x00000000_ =
       unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
       get_val(piVar3);
  iVar5 = (internal)
          std::ranges::__equal_fn::
          operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                    ((__equal_fn *)&std::ranges::equal,&e.keybuf_.off,0x224168);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  local_48._M_head_impl._0_1_ = iVar5;
  if (!(bool)iVar5) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_48,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x144,(char *)e.keybuf_.off);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string((string *)&e.keybuf_.off);
    if ((long *)CONCAT44(uStack_24,iStack_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,iStack_28) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::next
            (piVar3);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  local_48._M_head_impl._0_1_ =
       (internal)
       ((piVar3->stack_).c.
        super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
       (piVar3->stack_).c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur);
  if (!(bool)local_48._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_48,(AssertionResult *)"it.valid()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x146,(char *)e.keybuf_.off);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string((string *)&e.keybuf_.off);
    if ((long *)CONCAT44(uStack_24,iStack_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,iStack_28) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ppaVar1 = &verifier.key_views.
             super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::iterator
            ((iterator *)ppaVar1,
             (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)&verifier);
  local_29 = false;
  piVar3 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
           seek((iterator *)ppaVar1,(art_key_type)0x100000000000000,&local_29,false);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  local_48._M_head_impl._0_1_ =
       (internal)
       ((piVar3->stack_).c.
        super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
       (piVar3->stack_).c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur);
  if (!(bool)local_48._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_48,(AssertionResult *)"it.valid()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x14d,(char *)e.keybuf_.off);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string((string *)&e.keybuf_.off);
    if ((long *)CONCAT44(uStack_24,iStack_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,iStack_28) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  local_48._M_head_impl._0_1_ = (internal)local_29;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (local_29 == false) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_48,(AssertionResult *)0x1e67bb,"false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x14e,(char *)e.keybuf_.off);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string((string *)&e.keybuf_.off);
    if ((long *)CONCAT44(uStack_24,iStack_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,iStack_28) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  kVar6 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
          get_key(piVar3);
  uVar2 = *(undefined8 *)kVar6._M_ptr;
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar2 >> 0x38 | (ulong)(uVar2 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar2 & 0xff0000000000) >> 0x18 | (ulong)(uVar2 & 0xff00000000) >> 8 |
        (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
       uVar2 << 0x38);
  iStack_28 = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&e.keybuf_.off,"(decode(it.get_key()))","(1)",(unsigned_long *)&local_48,
             &stack0xffffffffffffffd8);
  if ((char)e.keybuf_.off == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x14f,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd8,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd8);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  join_0x00000010_0x00000000_ =
       unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
       get_val(piVar3);
  iVar5 = (internal)
          std::ranges::__equal_fn::
          operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                    ((__equal_fn *)&std::ranges::equal,&e.keybuf_.off,0x224168);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  local_48._M_head_impl._0_1_ = iVar5;
  if (!(bool)iVar5) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_48,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x151,(char *)e.keybuf_.off);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string((string *)&e.keybuf_.off);
    if ((long *)CONCAT44(uStack_24,iStack_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,iStack_28) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::next
            (piVar3);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  local_48._M_head_impl._0_1_ =
       (internal)
       ((piVar3->stack_).c.
        super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
       (piVar3->stack_).c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur);
  if (!(bool)local_48._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_48,(AssertionResult *)"it.valid()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x153,(char *)e.keybuf_.off);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string((string *)&e.keybuf_.off);
    if ((long *)CONCAT44(uStack_24,iStack_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,iStack_28) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_29 = true;
  ppaVar1 = &verifier.key_views.
             super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::iterator
            ((iterator *)ppaVar1,
             (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)&verifier);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)ppaVar1,(art_key_type)0x0,&local_29,true);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  local_48._M_head_impl._0_1_ =
       (internal)
       (e.stack_.c.
        super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node !=
       (_Map_pointer)
       e.stack_.c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_map_size);
  if (!(bool)local_48._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_48,(AssertionResult *)"it.valid()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x15c,(char *)e.keybuf_.off);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string((string *)&e.keybuf_.off);
    if ((long *)CONCAT44(uStack_24,iStack_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,iStack_28) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_48._M_head_impl._1_7_,local_29) ^ 1);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (local_29 != false) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_48,(AssertionResult *)0x1e67bb,"true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x15d,(char *)e.keybuf_.off);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string((string *)&e.keybuf_.off);
    if ((long *)CONCAT44(uStack_24,iStack_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,iStack_28) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  kVar6 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
          get_key((iterator *)
                  &verifier.key_views.
                   super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar2 = *(undefined8 *)kVar6._M_ptr;
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar2 >> 0x38 | (ulong)(uVar2 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar2 & 0xff0000000000) >> 0x18 | (ulong)(uVar2 & 0xff00000000) >> 8 |
        (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
       uVar2 << 0x38);
  iStack_28 = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&e.keybuf_.off,"(decode(it.get_key()))","(1)",(unsigned_long *)&local_48,
             &stack0xffffffffffffffd8);
  if ((char)e.keybuf_.off == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x15e,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd8,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd8);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  join_0x00000010_0x00000000_ =
       unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
       get_val((iterator *)
               &verifier.key_views.
                super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  iVar5 = (internal)
          std::ranges::__equal_fn::
          operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                    ((__equal_fn *)&std::ranges::equal,&e.keybuf_.off,0x224168);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  local_48._M_head_impl._0_1_ = iVar5;
  if (!(bool)iVar5) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_48,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x160,(char *)e.keybuf_.off);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string((string *)&e.keybuf_.off);
    if ((long *)CONCAT44(uStack_24,iStack_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,iStack_28) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::next
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  local_48._M_head_impl._0_1_ =
       (internal)
       (e.stack_.c.
        super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node ==
       (_Map_pointer)
       e.stack_.c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_map_size);
  if (!(bool)local_48._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_48,(AssertionResult *)"it.valid()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x162,(char *)e.keybuf_.off);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string((string *)&e.keybuf_.off);
    if ((long *)CONCAT44(uStack_24,iStack_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,iStack_28) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_29 = true;
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::iterator
            ((iterator *)ppaVar1,
             (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)&verifier);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)ppaVar1,(art_key_type)0x200000000000000,&local_29,true);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  local_48._M_head_impl._0_1_ =
       (internal)
       (e.stack_.c.
        super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node ==
       (_Map_pointer)
       e.stack_.c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_map_size);
  if (!(bool)local_48._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_48,(AssertionResult *)"it.valid()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x16a,(char *)e.keybuf_.off);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string((string *)&e.keybuf_.off);
    if ((long *)CONCAT44(uStack_24,iStack_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,iStack_28) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  local_48._M_head_impl._0_1_ = (internal)(local_29 ^ 1);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (local_29 != false) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_48,(AssertionResult *)0x1e67bb,"true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x16b,(char *)e.keybuf_.off);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string((string *)&e.keybuf_.off);
    if ((long *)CONCAT44(uStack_24,iStack_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,iStack_28) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_29 = true;
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::iterator
            ((iterator *)ppaVar1,
             (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)&verifier);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)ppaVar1,(art_key_type)0x0,&local_29,false);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  local_48._M_head_impl._0_1_ =
       (internal)
       (e.stack_.c.
        super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node ==
       (_Map_pointer)
       e.stack_.c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_map_size);
  if (!(bool)local_48._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_48,(AssertionResult *)"it.valid()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x173,(char *)e.keybuf_.off);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string((string *)&e.keybuf_.off);
    if ((long *)CONCAT44(uStack_24,iStack_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,iStack_28) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  local_48._M_head_impl._0_1_ = (internal)(local_29 ^ 1);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (local_29 != false) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_48,(AssertionResult *)0x1e67bb,"true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x174,(char *)e.keybuf_.off);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string((string *)&e.keybuf_.off);
    if ((long *)CONCAT44(uStack_24,iStack_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,iStack_28) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_29 = true;
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::iterator
            ((iterator *)ppaVar1,
             (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)&verifier);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)ppaVar1,(art_key_type)0x200000000000000,&local_29,false);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  local_48._M_head_impl._0_1_ =
       (internal)
       (e.stack_.c.
        super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node !=
       (_Map_pointer)
       e.stack_.c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_map_size);
  if (!(bool)local_48._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_48,(AssertionResult *)"it.valid()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x17c,(char *)e.keybuf_.off);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string((string *)&e.keybuf_.off);
    if ((long *)CONCAT44(uStack_24,iStack_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,iStack_28) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_48._M_head_impl._1_7_,local_29) ^ 1);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (local_29 != false) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_48,(AssertionResult *)0x1e67bb,"true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x17d,(char *)e.keybuf_.off);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string((string *)&e.keybuf_.off);
    if ((long *)CONCAT44(uStack_24,iStack_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,iStack_28) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  kVar6 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
          get_key((iterator *)
                  &verifier.key_views.
                   super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar2 = *(undefined8 *)kVar6._M_ptr;
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar2 >> 0x38 | (ulong)(uVar2 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar2 & 0xff0000000000) >> 0x18 | (ulong)(uVar2 & 0xff00000000) >> 8 |
        (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
       uVar2 << 0x38);
  iStack_28 = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&e.keybuf_.off,"(decode(it.get_key()))","(1)",(unsigned_long *)&local_48,
             &stack0xffffffffffffffd8);
  if ((char)e.keybuf_.off == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x17e,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd8,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd8);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  join_0x00000010_0x00000000_ =
       unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
       get_val((iterator *)
               &verifier.key_views.
                super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  iVar5 = (internal)
          std::ranges::__equal_fn::
          operator()<std::span<const_std::byte,_18446744073709551615UL>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                    ((__equal_fn *)&std::ranges::equal,&e.keybuf_.off,0x224168);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  local_48._M_head_impl._0_1_ = iVar5;
  if (!(bool)iVar5) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_48,
               (AssertionResult *)"std::ranges::equal(it.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x180,(char *)e.keybuf_.off);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string((string *)&e.keybuf_.off);
    if ((long *)CONCAT44(uStack_24,iStack_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,iStack_28) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::next
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  local_48._M_head_impl._0_1_ =
       (internal)
       (e.stack_.c.
        super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node ==
       (_Map_pointer)
       e.stack_.c.
       super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
       ._M_impl.super__Deque_impl_data._M_map_size);
  if (e.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node !=
      (_Map_pointer)
      e.stack_.c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e.keybuf_.off,(internal *)&local_48,(AssertionResult *)"it.valid()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x182,(char *)e.keybuf_.off);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    std::__cxx11::string::~string((string *)&e.keybuf_.off);
    if ((long *)CONCAT44(uStack_24,iStack_28) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,iStack_28) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)
             &verifier.key_views.
              super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  ~tree_verifier((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                  *)local_2b0);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, singleLeafSeek) {
  using Key = typename TypeParam::key_type;
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(1, unodb::test::test_values[1]);
  {  // exact match, forward traversal (GTE)
    auto e = db.test_only_iterator();
    bool match = false;
    auto& it = e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(1)},
                      match, true /*fwd*/);
    UNODB_EXPECT_TRUE(it.valid());
    UNODB_EXPECT_EQ(match, true);
    UNODB_EXPECT_EQ(decode(it.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    it.next();
    UNODB_EXPECT_FALSE(it.valid());
  }
  {  // exact match, reverse traversal (LTE)
    auto e = db.test_only_iterator();
    bool match = false;
    auto& it = e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(1)},
                      match, false /*fwd*/);
    UNODB_EXPECT_TRUE(it.valid());
    UNODB_EXPECT_TRUE(match);
    UNODB_EXPECT_EQ(decode(it.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    it.next();
    UNODB_EXPECT_FALSE(it.valid());  // nothing more in the iterator.
  }
  {  // forward traversal, before the first key in the data.
    // match=false and iterator is positioned on the first key in the
    // data.
    bool match = true;
    auto it = db.test_only_iterator();
    it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
            true /*fwd*/);
    UNODB_EXPECT_TRUE(it.valid());
    UNODB_EXPECT_FALSE(match);
    UNODB_EXPECT_EQ(decode(it.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    it.next();
    UNODB_EXPECT_FALSE(it.valid());
  }
  {  // forward traversal, after the last key in the data.  match=false
    // and iterator is invalidated.
    bool match = true;
    auto it = db.test_only_iterator();
    it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(2)}, match,
            true /*fwd*/);
    UNODB_EXPECT_FALSE(it.valid());
    UNODB_EXPECT_FALSE(match);
  }
  {  // reverse traversal, before the first key in the data.
    // match=false and iterator is invalidated.
    bool match = true;
    auto it = db.test_only_iterator();
    it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
            false /*fwd*/);
    UNODB_EXPECT_FALSE(it.valid());
    UNODB_EXPECT_FALSE(match);
  }
  {  // reverse traversal, after the last key in the data.  match=false
    // and iterator is positioned at the last key.
    bool match = true;
    auto it = db.test_only_iterator();
    it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(2)}, match,
            false /*fwd*/);
    UNODB_EXPECT_TRUE(it.valid());
    UNODB_EXPECT_FALSE(match);
    UNODB_EXPECT_EQ(decode(it.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    it.next();
    UNODB_EXPECT_FALSE(it.valid());
  }
}